

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnShow(XL *out)

{
  printf("Info: \n Model: %s\n Loss: %s\n",*(undefined8 *)((long)*out + 8),
         *(undefined8 *)((long)*out + 0x28));
  return 0;
}

Assistant:

XL_DLL int XLearnShow(XL *out) {
  API_BEGIN()
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  printf("Info: \n Model: %s\n Loss: %s\n", 
    xl->GetHyperParam().score_func.c_str(),
    xl->GetHyperParam().loss_func.c_str());
  API_END()
}